

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

LaneArray<4> * __thiscall
wasm::getLanes<unsigned_int,4>(LaneArray<4> *__return_storage_ptr__,wasm *this,Literal *val)

{
  uint uVar1;
  undefined1 auVar2 [13];
  uint3 uVar3;
  uint5 uVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [13];
  LaneArray<4> *extraout_RAX;
  long lVar7;
  array<unsigned_char,_16UL> aVar8;
  anon_union_16_6_1532cd5a_for_Literal_0 local_50;
  undefined8 local_40;
  undefined1 local_38 [8];
  array<unsigned_char,_16UL> bytes;
  
  if (*(long *)(this + 0x10) == 6) {
    aVar8 = Literal::getv128((Literal *)this);
    local_38[0] = aVar8._M_elems[0];
    local_38[1] = aVar8._M_elems[1];
    local_38[2] = aVar8._M_elems[2];
    local_38[3] = aVar8._M_elems[3];
    local_38[4] = aVar8._M_elems[4];
    local_38[5] = aVar8._M_elems[5];
    local_38[6] = aVar8._M_elems[6];
    local_38[7] = aVar8._M_elems[7];
    bytes._M_elems[0] = aVar8._M_elems[8];
    bytes._M_elems[1] = aVar8._M_elems[9];
    bytes._M_elems[2] = aVar8._M_elems[10];
    bytes._M_elems[3] = aVar8._M_elems[0xb];
    bytes._M_elems[4] = aVar8._M_elems[0xc];
    bytes._M_elems[5] = aVar8._M_elems[0xd];
    bytes._M_elems[6] = aVar8._M_elems[0xe];
    bytes._M_elems[7] = aVar8._M_elems[0xf];
    __return_storage_ptr__->_M_elems[0].field_0.i64 = 0;
    __return_storage_ptr__->_M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
    __return_storage_ptr__->_M_elems[0].type.id = 0;
    __return_storage_ptr__->_M_elems[1].field_0.i64 = 0;
    __return_storage_ptr__->_M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
    __return_storage_ptr__->_M_elems[1].type.id = 0;
    __return_storage_ptr__->_M_elems[2].field_0.i64 = 0;
    __return_storage_ptr__->_M_elems[2].field_0.func.super_IString.str._M_str = (char *)0x0;
    __return_storage_ptr__->_M_elems[2].type.id = 0;
    __return_storage_ptr__->_M_elems[3].field_0.i64 = 0;
    __return_storage_ptr__->_M_elems[3].field_0.func.super_IString.str._M_str = (char *)0x0;
    __return_storage_ptr__->_M_elems[3].type.id = 0;
    lVar7 = 0;
    do {
      uVar1 = *(uint *)(local_38 + lVar7 * 4);
      auVar2[0xc] = (char)(uVar1 >> 0x18);
      auVar2._0_12_ = ZEXT712(0);
      uVar4 = CONCAT32(auVar2._10_3_,(ushort)(byte)(uVar1 >> 0x10));
      auVar6._5_8_ = 0;
      auVar6._0_5_ = uVar4;
      uVar3 = auVar2._10_3_ >> 0x10;
      auVar5._12_3_ = uVar3;
      auVar5._0_12_ = ZEXT312(uVar3) << 0x40;
      local_50.i32 = (uint)(((ulong)auVar5._8_7_ & 0xffffffff) * 0x1000000) |
                     (int)CONCAT72(SUB137(auVar6 << 0x40,6),(ushort)(byte)(uVar1 >> 8)) * 0x100 |
                     (uint)(((ulong)uVar4 & 0xffffffff) * 0x10000) | uVar1 & 0xff;
      local_40 = 2;
      if ((anon_union_16_6_1532cd5a_for_Literal_0 *)__return_storage_ptr__ != &local_50) {
        Literal::~Literal(__return_storage_ptr__->_M_elems);
        Literal::Literal(__return_storage_ptr__->_M_elems,(Literal *)&local_50.func);
      }
      Literal::~Literal((Literal *)&local_50.func);
      lVar7 = lVar7 + 1;
      __return_storage_ptr__ = (LaneArray<4> *)((long)__return_storage_ptr__ + 0x18);
    } while (lVar7 != 4);
    return extraout_RAX;
  }
  __assert_fail("val.type == Type::v128",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                ,0x6d7,
                "LaneArray<Lanes> wasm::getLanes(const Literal &) [LaneT = unsigned int, Lanes = 4]"
               );
}

Assistant:

static LaneArray<Lanes> getLanes(const Literal& val) {
  assert(val.type == Type::v128);
  const size_t lane_width = 16 / Lanes;
  std::array<uint8_t, 16> bytes = val.getv128();
  LaneArray<Lanes> lanes;
  for (size_t lane_index = 0; lane_index < Lanes; ++lane_index) {
    LaneT lane(0);
    for (size_t offset = 0; offset < lane_width; ++offset) {
      lane |= LaneT(bytes.at(lane_index * lane_width + offset))
              << LaneT(8 * offset);
    }
    lanes.at(lane_index) = Literal(lane);
  }
  return lanes;
}